

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rough_plastic.hpp
# Opt level: O1

Color __thiscall RoughPlasticBSDF::f(RoughPlasticBSDF *this,vec3f *wo,vec3f *wi,HitInfo *hit)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Image *this_00;
  undefined1 auVar10 [16];
  undefined4 extraout_EAX;
  undefined4 uVar11;
  int iVar12;
  int iVar13;
  Color CVar14;
  vec3f local_80;
  vec3f local_70;
  Color local_60;
  vec3f local_50;
  vec3f local_40;
  
  local_40.x = 0.0;
  local_40.y = 0.0;
  local_40.z = 0.0;
  local_50.x = 0.0;
  local_50.y = 0.0;
  local_50.z = 0.0;
  BSDF::getLocalBasis(&(hit->super_Hit).Ns,&local_40,&local_50);
  fVar1 = wo->x;
  fVar2 = wo->y;
  fVar3 = wo->z;
  fVar4 = (hit->super_Hit).Ns.x;
  fVar5 = (hit->super_Hit).Ns.y;
  fVar6 = (hit->super_Hit).Ns.z;
  local_70.z = fVar3 * fVar6 + fVar1 * fVar4 + fVar2 * fVar5;
  local_70.y = fVar3 * local_50.z + fVar1 * local_50.x + fVar2 * local_50.y;
  local_70.x = fVar3 * local_40.z + fVar1 * local_40.x + fVar2 * local_40.y;
  fVar7 = wi->x;
  fVar8 = wi->y;
  fVar9 = wi->z;
  local_80.z = fVar6 * fVar9 + fVar4 * fVar7 + fVar5 * fVar8;
  local_80.y = fVar9 * local_50.z + fVar7 * local_50.x + fVar8 * local_50.y;
  local_80.x = fVar9 * local_40.z + fVar7 * local_40.x + fVar8 * local_40.y;
  fVar4 = (hit->super_Hit).Ng.x;
  fVar5 = (hit->super_Hit).Ng.y;
  fVar6 = (hit->super_Hit).Ng.z;
  iVar12 = -(uint)(0.0 < fVar6 * fVar3 + fVar4 * fVar1 + fVar5 * fVar2);
  iVar13 = -(uint)(0.0 < fVar6 * fVar9 + fVar4 * fVar7 + fVar5 * fVar8);
  auVar10._4_4_ = iVar12;
  auVar10._0_4_ = iVar12;
  auVar10._8_4_ = iVar13;
  auVar10._12_4_ = iVar13;
  uVar11 = movmskpd(extraout_EAX,auVar10);
  CVar14 = (Color)ZEXT412(0);
  if ((POPCOUNT((char)uVar11) & 1U) == 0) {
    this_00 = (this->super_BSDF).albedoTexture;
    if (this_00 == (Image *)0x0) {
      local_60 = (this->super_BSDF).albedoConst;
    }
    else {
      local_60._0_8_ = (ulong)(hit->super_Hit).uv ^ 0x8000000000000000;
      local_60 = Image::sample(this_00,(vec2f *)&local_60);
    }
    CVar14 = f(this,&local_60,&local_70,&local_80);
  }
  return CVar14;
}

Assistant:

Color f(const vec3f& wo, const vec3f& wi, const HitInfo& hit) const
	{
		vec3f N1,N2;
		getLocalBasis(hit.Ns, N1, N2);
		// transform wo, wi to local surface Ns' = (0,0,1)
		vec3f woL = vec3f(dot(wo,N1), dot(wo,N2), dot(wo,hit.Ns));
		vec3f wiL = vec3f(dot(wi,N1), dot(wi,N2), dot(wi,hit.Ns));
		// use Ng to determine whether BRDF or BTDF is used
		bool through = (dot(wo, hit.Ng)>0) ^ (dot(wi, hit.Ng)>0);
		BxDF::Type allowed = through? BxDF::TRANSMIT : BxDF::REFLECT;
		return (BxDF::REFLECT & allowed)? f(albedo(hit.uv), woL, wiL): 0;
	}